

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
          (PrimitiveOneofFieldGenerator *this,FieldDescriptor *descriptor,Params *params)

{
  _Rb_tree_header *p_Var1;
  Params local_100;
  
  (this->super_FieldGenerator).params_ = params;
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__PrimitiveOneofFieldGenerator_00429b28;
  this->descriptor_ = descriptor;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Params::Params(&local_100,params);
  anon_unknown_5::SetPrimitiveVariables(descriptor,&local_100,&this->variables_);
  Params::~Params(&local_100);
  SetCommonOneofVariables(descriptor,&this->variables_);
  return;
}

Assistant:

PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator(
    const FieldDescriptor* descriptor, const Params& params)
  : FieldGenerator(params), descriptor_(descriptor) {
    SetPrimitiveVariables(descriptor, params, &variables_);
    SetCommonOneofVariables(descriptor, &variables_);
}